

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O3

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans,char *ept,HelicsError *err)

{
  Translator *this;
  TranslatorObject *pTVar1;
  size_t sVar2;
  string_view newTarget;
  
  pTVar1 = getTranslatorObj(trans,err);
  if ((pTVar1 != (TranslatorObject *)0x0) && (this = pTVar1->transPtr, this != (Translator *)0x0)) {
    if (ept == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "The supplied string argument is null and therefore invalid";
      }
    }
    else {
      sVar2 = strlen(ept);
      newTarget._M_str = ept;
      newTarget._M_len = sVar2;
      helics::Interface::addDestinationTarget(&this->super_Interface,newTarget,ENDPOINT);
    }
  }
  return;
}

Assistant:

void helicsTranslatorAddDestinationEndpoint(HelicsTranslator trans, const char* ept, HelicsError* err)
{
    auto* translator = getTranslator(trans, err);
    if (translator == nullptr) {
        return;
    }
    CHECK_NULL_STRING(ept, void());
    try {
        translator->addDestinationEndpoint(ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}